

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ptls_openssl_load_certificates(ptls_context_t *ctx,X509 *cert,stack_st_X509 *chain)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  OPENSSL_STACK *pOVar4;
  long lVar5;
  void *__ptr;
  stack_st_X509 *in_RDX;
  long in_RSI;
  long in_RDI;
  size_t i_1;
  int i;
  int ret;
  size_t count;
  size_t slot;
  ptls_iovec_t *list;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar6;
  long local_40;
  int local_38;
  int local_34;
  long local_28;
  
  local_28 = 0;
  uVar1 = (uint)(in_RSI != 0);
  if (in_RDX == (stack_st_X509 *)0x0) {
    iVar2 = 0;
  }
  else {
    pOVar4 = ossl_check_const_X509_sk_type(in_RDX);
    iVar2 = OPENSSL_sk_num(pOVar4);
  }
  lVar5 = (long)(int)(uVar1 + iVar2);
  if (*(long *)(in_RDI + 0x20) != 0) {
    __assert_fail("ctx->certificates.list == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/openssl.c"
                  ,0x4a0,
                  "int ptls_openssl_load_certificates(ptls_context_t *, X509 *, struct stack_st_X509 *)"
                 );
  }
  __ptr = malloc(lVar5 << 4);
  if (__ptr == (void *)0x0) {
    local_34 = 0x201;
  }
  else {
    if (in_RSI != 0) {
      local_28 = 1;
      local_34 = serialize_cert((X509 *)CONCAT44(uVar1,iVar2),
                                (ptls_iovec_t *)
                                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      if (local_34 != 0) goto LAB_00105212;
    }
    if (in_RDX != (stack_st_X509 *)0x0) {
      local_38 = 0;
      while( true ) {
        iVar6 = local_38;
        pOVar4 = ossl_check_const_X509_sk_type(in_RDX);
        iVar3 = OPENSSL_sk_num(pOVar4);
        if (iVar6 == iVar3) break;
        pOVar4 = ossl_check_const_X509_sk_type(in_RDX);
        OPENSSL_sk_value(pOVar4,local_38);
        local_28 = local_28 + 1;
        local_34 = serialize_cert((X509 *)CONCAT44(uVar1,iVar2),
                                  (ptls_iovec_t *)CONCAT44(iVar6,in_stack_ffffffffffffffb0));
        if (local_34 != 0) goto LAB_00105212;
        local_38 = local_38 + 1;
      }
    }
    if (local_28 != lVar5) {
      __assert_fail("slot == count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/openssl.c"
                    ,0x4b2,
                    "int ptls_openssl_load_certificates(ptls_context_t *, X509 *, struct stack_st_X509 *)"
                   );
    }
    *(void **)(in_RDI + 0x20) = __ptr;
    *(long *)(in_RDI + 0x28) = lVar5;
    local_34 = 0;
  }
LAB_00105212:
  if ((local_34 != 0) && (__ptr != (void *)0x0)) {
    for (local_40 = 0; local_40 != local_28; local_40 = local_40 + 1) {
      free(*(void **)((long)__ptr + local_40 * 0x10));
    }
    free(__ptr);
  }
  return local_34;
}

Assistant:

int ptls_openssl_load_certificates(ptls_context_t *ctx, X509 *cert, STACK_OF(X509) * chain)
{
    ptls_iovec_t *list = NULL;
    size_t slot = 0, count = (cert != NULL) + (chain != NULL ? sk_X509_num(chain) : 0);
    int ret;

    assert(ctx->certificates.list == NULL);

    if ((list = malloc(sizeof(*list) * count)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (cert != NULL) {
        if ((ret = serialize_cert(cert, list + slot++)) != 0)
            goto Exit;
    }
    if (chain != NULL) {
        int i;
        for (i = 0; i != sk_X509_num(chain); ++i) {
            if ((ret = serialize_cert(sk_X509_value(chain, i), list + slot++)) != 0)
                goto Exit;
        }
    }

    assert(slot == count);

    ctx->certificates.list = list;
    ctx->certificates.count = count;
    ret = 0;

Exit:
    if (ret != 0 && list != NULL) {
        size_t i;
        for (i = 0; i != slot; ++i)
            free(list[i].base);
        free(list);
    }
    return ret;
}